

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O3

Oop __thiscall
Lodtalk::MethodCompiler::visitMessageSendNode(MethodCompiler *this,MessageSendNode *node)

{
  Assembler *this_00;
  pointer ppNVar1;
  bool bVar2;
  int iVar3;
  CompilerOptimizedSelector optimizedSelector;
  Node *pNVar4;
  vector<Lodtalk::AST::MessageSendNode_*,_std::allocator<Lodtalk::AST::MessageSendNode_*>_> *pvVar5;
  pointer ppMVar6;
  Oop OVar7;
  vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_> *pvVar8;
  uint uVar9;
  size_t __n;
  ulong uVar10;
  void *__buf;
  vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_> *__range2;
  MessageSendNode *this_01;
  uint uVar11;
  int in_R8D;
  Node **arg;
  pointer ppNVar12;
  
  pNVar4 = AST::MessageSendNode::getReceiver(node);
  iVar3 = (*pNVar4->_vptr_Node[7])(pNVar4);
  pvVar5 = AST::MessageSendNode::getChainedMessages(node);
  if (((char)iVar3 == '\0') &&
     ((pvVar5->
      super__Vector_base<Lodtalk::AST::MessageSendNode_*,_std::allocator<Lodtalk::AST::MessageSendNode_*>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (pvVar5->
      super__Vector_base<Lodtalk::AST::MessageSendNode_*,_std::allocator<Lodtalk::AST::MessageSendNode_*>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    OVar7 = AST::MessageSendNode::getSelectorOop(node);
    optimizedSelector = VMContext::getCompilerOptimizedSelectorId(this->context,OVar7);
    if ((optimizedSelector != Invalid) &&
       (bVar2 = generateOptimizedMessage(this,node,optimizedSelector), bVar2)) goto LAB_00138650;
  }
  pNVar4 = AST::MessageSendNode::getReceiver(node);
  (*pNVar4->_vptr_Node[2])(pNVar4,this);
  ppMVar6 = (pvVar5->
            super__Vector_base<Lodtalk::AST::MessageSendNode_*,_std::allocator<Lodtalk::AST::MessageSendNode_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  uVar10 = (long)(pvVar5->
                 super__Vector_base<Lodtalk::AST::MessageSendNode_*,_std::allocator<Lodtalk::AST::MessageSendNode_*>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)ppMVar6;
  if ((uVar10 >> 0x22 & 1) == 0) {
    uVar9 = (int)(uVar10 >> 3) - 1;
    __n = (size_t)uVar9;
    this_00 = &this->gen;
    uVar11 = 0xffffffff;
    bVar2 = true;
    do {
      this_01 = node;
      if (-1 < (int)uVar11) {
        __n = (size_t)uVar11;
        this_01 = ppMVar6[__n];
      }
      OVar7 = AST::MessageSendNode::getSelectorOop(this_01);
      if (!bVar2) {
        MethodAssembler::Assembler::popStackTop(this_00);
      }
      if (uVar11 != uVar9) {
        MethodAssembler::Assembler::duplicateStackTop(this_00);
      }
      pvVar8 = AST::MessageSendNode::getArguments(this_01);
      ppNVar1 = (pvVar8->
                super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>).
                _M_impl.super__Vector_impl_data._M_finish;
      for (ppNVar12 = (pvVar8->
                      super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>
                      )._M_impl.super__Vector_impl_data._M_start; ppNVar12 != ppNVar1;
          ppNVar12 = ppNVar12 + 1) {
        (*(*ppNVar12)->_vptr_Node[2])(*ppNVar12,this);
      }
      __buf = (void *)((ulong)((long)(pvVar8->
                                     super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>
                                     )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pvVar8->
                                    super__Vector_base<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>
                                    )._M_impl.super__Vector_impl_data._M_start) >> 3);
      if ((char)iVar3 == '\0') {
        MethodAssembler::Assembler::send(this_00,OVar7.field_0._0_4_,__buf,__n,in_R8D);
      }
      else {
        MethodAssembler::Assembler::superSend(this_00,OVar7,(int)__buf);
      }
      uVar11 = uVar11 + 1;
      ppMVar6 = (pvVar5->
                super__Vector_base<Lodtalk::AST::MessageSendNode_*,_std::allocator<Lodtalk::AST::MessageSendNode_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
      __n = (ulong)((long)(pvVar5->
                          super__Vector_base<Lodtalk::AST::MessageSendNode_*,_std::allocator<Lodtalk::AST::MessageSendNode_*>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)ppMVar6) >> 3;
      bVar2 = false;
    } while ((int)uVar11 < (int)__n);
  }
LAB_00138650:
  return (Oop)&NilObject;
}

Assistant:

Oop MethodCompiler::visitMessageSendNode(MessageSendNode *node)
{
	// Visit the receiver.
	bool isSuper = node->getReceiver()->isSuperReference();

	// Visit the arguments in reverse order.
	auto &chained = node->getChainedMessages();

    // Only try to optimize some message when they aren't in a chain.
    if(!isSuper && chained.empty())
    {
        auto selector = node->getSelectorOop();

        // If this is an optimized message, try to optimize
        auto optimizedSelector = context->getCompilerOptimizedSelectorId(selector);
        if(optimizedSelector != CompilerOptimizedSelector::Invalid)
        {
            if(generateOptimizedMessage(node, optimizedSelector))
                return Oop();
        }
    }

    node->getReceiver()->acceptVisitor(this);

	// Send each message in the chain
	bool first = true;
    int lastIndex = (int)chained.size() - 1;
	for(int i = -1; i < (int)chained.size(); ++i)
	{
		auto message = i < 0 ? node : chained[i];
		auto selector = message->getSelectorOop();

		if(first)
			first = false;
		else
			gen.popStackTop();
        if(i != lastIndex)
            gen.duplicateStackTop();

		// Evaluate the arguments.
		auto &arguments = message->getArguments();
		for(auto &arg : arguments)
			arg->acceptVisitor(this);

		// Send the message.
        if(isSuper)
            gen.superSend(selector, (int)arguments.size());
        else
		    gen.send(selector, (int)arguments.size());
	}

	return Oop();
}